

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O1

Point3f pbrt::weightBoundary(SDVertex *vert,Float beta)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  Tuple3<pbrt::Point3,_float> *pTVar9;
  int iVar10;
  float *pfVar11;
  float *pfVar12;
  int iVar13;
  Point3f *p;
  SDFace *pSVar14;
  size_t count;
  bool bVar15;
  float fVar16;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  Point3f PVar17;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
  pRing;
  polymorphic_allocator<pbrt::Point3<float>_> local_118;
  Tuple3<pbrt::Point3,_float> local_110;
  undefined1 local_100 [20];
  float local_ec;
  float local_e8 [50];
  
  pSVar14 = vert->startFace;
  if (vert->boundary == false) {
    iVar13 = 0;
    do {
      iVar10 = SDFace::vnum(pSVar14,vert);
      pSVar14 = pSVar14->f[iVar10];
      iVar13 = iVar13 + 1;
    } while (pSVar14 != vert->startFace);
  }
  else {
    iVar13 = 0;
    do {
      iVar10 = SDFace::vnum(pSVar14,vert);
      pSVar14 = pSVar14->f[iVar10];
      iVar13 = iVar13 + 1;
    } while (pSVar14 != (SDFace *)0x0);
    pSVar14 = vert->startFace;
    do {
      iVar10 = SDFace::vnum(pSVar14,vert);
      pSVar14 = pSVar14->f[iVar10 + 2 + ((iVar10 + 2) / 3) * -3];
      iVar13 = iVar13 + 1;
    } while (pSVar14 != (SDFace *)0x0);
  }
  count = (size_t)iVar13;
  local_118.memoryResource = pstd::pmr::new_delete_resource();
  local_110.z = 0.0;
  local_110.x = 0.0;
  local_110.y = 0.0;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  InlinedVector((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
                 *)local_100,count,(Point3<float> *)&local_110,&local_118);
  p = (Point3f *)local_100._8_8_;
  if ((Point3f *)local_100._8_8_ == (Point3f *)0x0) {
    p = (Point3f *)(local_100 + 0x10);
  }
  SDVertex::oneRing(vert,p);
  auVar8._4_4_ = in_XMM0_Db;
  auVar8._0_4_ = beta;
  auVar8._8_4_ = in_XMM0_Dc;
  auVar8._12_4_ = in_XMM0_Dd;
  auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar8,ZEXT416(0x3f800000));
  fVar1 = (vert->p).super_Tuple3<pbrt::Point3,_float>.z;
  fVar16 = auVar8._0_4_;
  pfVar12 = &((Tuple3<pbrt::Point3,_float> *)local_100._8_8_)->y;
  pTVar9 = (Tuple3<pbrt::Point3,_float> *)local_100._8_8_;
  bVar15 = (Point3f *)local_100._8_8_ != (Point3f *)0x0;
  if (!bVar15) {
    pfVar12 = &local_ec;
    local_100._8_8_ = (Point3f *)(local_100 + 0x10);
  }
  pfVar11 = local_e8;
  if (bVar15) {
    pfVar11 = &pTVar9->z;
  }
  fVar2 = *pfVar11;
  fVar3 = (((Point3f *)(local_100._8_8_ + (count - 1) * 0xc))->super_Tuple3<pbrt::Point3,_float>).z;
  uVar4 = (vert->p).super_Tuple3<pbrt::Point3,_float>.x;
  uVar6 = (vert->p).super_Tuple3<pbrt::Point3,_float>.y;
  auVar8 = vinsertps_avx(ZEXT416((uint)(((Point3f *)local_100._8_8_)->
                                       super_Tuple3<pbrt::Point3,_float>).x),ZEXT416((uint)*pfVar12)
                         ,0x10);
  uVar5 = (((Point3f *)(local_100._8_8_ + (count - 1) * 0xc))->super_Tuple3<pbrt::Point3,_float>).x;
  uVar7 = (((Point3f *)(local_100._8_8_ + (count - 1) * 0xc))->super_Tuple3<pbrt::Point3,_float>).y;
  PVar17.super_Tuple3<pbrt::Point3,_float>.x =
       fVar16 * (float)uVar4 + auVar8._0_4_ * beta + (float)uVar5 * beta;
  PVar17.super_Tuple3<pbrt::Point3,_float>.y =
       fVar16 * (float)uVar6 + auVar8._4_4_ * beta + (float)uVar7 * beta;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  ~InlinedVector((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
                  *)local_100);
  PVar17.super_Tuple3<pbrt::Point3,_float>.z = fVar16 * fVar1 + beta * fVar2 + beta * fVar3;
  return (Point3f)PVar17.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

static Point3f weightBoundary(SDVertex *vert, Float beta) {
    // Put _vert_ one-ring in _pRing_
    int valence = vert->valence();
    InlinedVector<Point3f, 16> pRing(valence);

    vert->oneRing(pRing.data());
    Point3f p = (1 - 2 * beta) * vert->p;
    p += beta * pRing[0];
    p += beta * pRing[valence - 1];
    return p;
}